

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

aiNode * get_node_for_mesh(uint meshIndex,aiNode *node)

{
  uint uVar1;
  aiNode **ppaVar2;
  aiNode *paVar3;
  ulong uVar4;
  
  if ((ulong)node->mNumMeshes != 0) {
    uVar4 = 0;
    do {
      if (node->mMeshes[uVar4] == meshIndex) {
        return node;
      }
      uVar4 = uVar4 + 1;
    } while (node->mNumMeshes != uVar4);
  }
  uVar1 = node->mNumChildren;
  if ((ulong)uVar1 != 0) {
    ppaVar2 = node->mChildren;
    uVar4 = 0;
    do {
      paVar3 = get_node_for_mesh(meshIndex,ppaVar2[uVar4]);
      if (paVar3 != (aiNode *)0x0) {
        return paVar3;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return (aiNode *)0x0;
}

Assistant:

aiNode* get_node_for_mesh(unsigned int meshIndex, aiNode* node)
{
    for (size_t i = 0; i < node->mNumMeshes; ++i) {
        if (node->mMeshes[i] == meshIndex) {
            return node;
        }
    }
    for (size_t i = 0; i < node->mNumChildren; ++i) {
        aiNode* ret = get_node_for_mesh(meshIndex, node->mChildren[i]);
        if (ret) { return ret; }
    }
    return nullptr;
}